

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurlURLInputStream.cpp
# Opt level: O2

size_t __thiscall
xercesc_4_0::CurlURLInputStream::readCallback
          (CurlURLInputStream *this,char *buffer,size_t size,size_t nitems)

{
  ulong __n;
  
  __n = this->fPayloadLen;
  if (size * nitems < this->fPayloadLen) {
    __n = size * nitems;
  }
  memcpy(buffer,this->fPayload,__n);
  this->fPayload = this->fPayload + __n;
  this->fPayloadLen = this->fPayloadLen - __n;
  return __n;
}

Assistant:

size_t
CurlURLInputStream::readCallback(char *buffer,
                                 size_t size,
                                 size_t nitems)
{
    XMLSize_t len = size * nitems;
    if(len > fPayloadLen) len = fPayloadLen;

    memcpy(buffer, fPayload, len);

    fPayload += len;
    fPayloadLen -= len;

    return len;
}